

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O1

void __thiscall QMdiSubWindow::setSystemMenu(QMdiSubWindow *this,QMenu *systemMenu)

{
  long lVar1;
  long lVar2;
  int *piVar3;
  QMenu *pQVar4;
  undefined8 uVar5;
  long *plVar6;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if (systemMenu != (QMenu *)0x0) {
    if ((*(long *)(lVar1 + 0x308) == 0) || (*(int *)(*(long *)(lVar1 + 0x308) + 4) == 0)) {
      pQVar4 = (QMenu *)0x0;
    }
    else {
      pQVar4 = *(QMenu **)(lVar1 + 0x310);
    }
    if (pQVar4 == systemMenu) {
      setSystemMenu();
      return;
    }
  }
  lVar2 = *(long *)(lVar1 + 0x308);
  if (((lVar2 != 0) && (*(int *)(lVar2 + 4) != 0)) && (*(long *)(lVar1 + 0x310) != 0)) {
    if ((lVar2 == 0) || (*(int *)(lVar2 + 4) == 0)) {
      plVar6 = (long *)0x0;
    }
    else {
      plVar6 = *(long **)(lVar1 + 0x310);
    }
    if (plVar6 != (long *)0x0) {
      (**(code **)(*plVar6 + 0x20))();
    }
    piVar3 = *(int **)(lVar1 + 0x308);
    *(undefined8 *)(lVar1 + 0x308) = 0;
    *(undefined8 *)(lVar1 + 0x310) = 0;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
      }
    }
  }
  if (systemMenu != (QMenu *)0x0) {
    if (*(QMdiSubWindow **)(*(long *)&(systemMenu->super_QWidget).field_0x8 + 0x10) != this) {
      QWidget::setParent(&systemMenu->super_QWidget,&this->super_QWidget);
    }
    uVar5 = QtSharedPointer::ExternalRefCountData::getAndRef((QObject *)systemMenu);
    piVar3 = *(int **)(lVar1 + 0x308);
    *(undefined8 *)(lVar1 + 0x308) = uVar5;
    *(QMenu **)(lVar1 + 0x310) = systemMenu;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        operator_delete(piVar3);
        return;
      }
    }
  }
  return;
}

Assistant:

void QMdiSubWindow::setSystemMenu(QMenu *systemMenu)
{
    Q_D(QMdiSubWindow);
    if (Q_UNLIKELY(systemMenu && systemMenu == d->systemMenu)) {
        qWarning("QMdiSubWindow::setSystemMenu: system menu is already set");
        return;
    }

    if (d->systemMenu) {
        delete d->systemMenu;
        d->systemMenu = nullptr;
    }

    if (!systemMenu)
        return;

    if (systemMenu->parent() != this)
        systemMenu->setParent(this);
    d->systemMenu = systemMenu;
}